

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O2

xmlNodePtr getNext(xmlNodePtr cur,char *xpath)

{
  int *piVar1;
  xmlXPathContextPtr_conflict pxVar2;
  long lVar3;
  int *piVar4;
  xmlNodePtr pxVar5;
  
  pxVar2 = ctxtXPath;
  if (xpath != (char *)0x0 && cur->doc != (xmlDocPtr)0x0) {
    ctxtXPath->doc = cur->doc;
    pxVar2->node = cur;
    lVar3 = xmlXPathCompile(xpath);
    if (lVar3 == 0) {
      fprintf(_stderr,"Failed to compile %s\n",xpath);
      return (xmlNodePtr)0x0;
    }
    piVar4 = (int *)xmlXPathCompiledEval(lVar3,ctxtXPath);
    xmlXPathFreeCompExpr(lVar3);
    if (piVar4 != (int *)0x0) {
      if ((((*piVar4 == 1) && (piVar1 = *(int **)(piVar4 + 2), piVar1 != (int *)0x0)) &&
          (0 < *piVar1)) && (*(undefined8 **)(piVar1 + 2) != (undefined8 *)0x0)) {
        pxVar5 = (xmlNodePtr)**(undefined8 **)(piVar1 + 2);
      }
      else {
        pxVar5 = (xmlNodePtr)0x0;
      }
      xmlXPathFreeObject(piVar4);
      return pxVar5;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

static xmlNodePtr
getNext(xmlNodePtr cur, const char *xpath) {
    xmlNodePtr ret = NULL;
    xmlXPathObjectPtr res;
    xmlXPathCompExprPtr comp;

    if ((cur == NULL)  || (cur->doc == NULL) || (xpath == NULL))
        return(NULL);
    ctxtXPath->doc = cur->doc;
    ctxtXPath->node = cur;
    comp = xmlXPathCompile(BAD_CAST xpath);
    if (comp == NULL) {
        fprintf(stderr, "Failed to compile %s\n", xpath);
	return(NULL);
    }
    res = xmlXPathCompiledEval(comp, ctxtXPath);
    xmlXPathFreeCompExpr(comp);
    if (res == NULL)
        return(NULL);
    if ((res->type == XPATH_NODESET) &&
        (res->nodesetval != NULL) &&
	(res->nodesetval->nodeNr > 0) &&
	(res->nodesetval->nodeTab != NULL))
	ret = res->nodesetval->nodeTab[0];
    xmlXPathFreeObject(res);
    return(ret);
}